

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_errors.c
# Opt level: O1

char * SUNGetErrMsg(SUNErrCode code)

{
  if (code + 9999U < 0x1e) {
    return &DAT_0011075c + *(int *)(&DAT_0011075c + (ulong)(code + 9999U) * 4);
  }
  return "unknown error";
}

Assistant:

const char* SUNGetErrMsg(SUNErrCode code)
{
#define SUN_EXPAND_TO_CASES(name, description) \
  case name: return description; break;

  switch (code)
  {
    SUN_ERR_CODE_LIST(SUN_EXPAND_TO_CASES)
  default: return "unknown error";
  }

  return NULL;
}